

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O2

bool __thiscall
Refal2::COperationsExecuter::matchLeftWithQulifierBegin_V
          (COperationsExecuter *this,TQualifierIndex qualifier)

{
  bool bVar1;
  
  bVar1 = shiftLeft(this);
  if ((bVar1) && (bVar1 = checkQualifier(this,this->left,qualifier), bVar1)) {
    if (((this->left->super_CUnit).type & UT_LeftParen) != 0) {
      this->left = (CUnitNode *)(this->left->super_CUnit).field_1;
    }
    this->operation = this->operation->next;
    saveState(this);
    return true;
  }
  return false;
}

Assistant:

inline bool COperationsExecuter::matchLeftWithQulifierBegin_V(
	const TQualifierIndex qualifier )
{
	if( shiftLeft() && checkQualifier( left, qualifier ) ) {
		if( left->IsLeftParen() ) {
			left = left->PairedParen();
		}
		nextOperation();
		saveState();
		return true;
	} else {
		return false;
	}
}